

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

JSONNode __thiscall JSONNode::as_array(JSONNode *this)

{
  internalJSONNode *piVar1;
  uchar uVar2;
  JSONNode **ppJVar3;
  JSONNode **ppJVar4;
  JSONNode *in_RSI;
  allocator local_39;
  json_string local_38;
  
  piVar1 = in_RSI->internal;
  std::__cxx11::string::string((string *)&local_38,"no internal",&local_39);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  uVar2 = type(in_RSI);
  if (uVar2 == '\x04') {
    JSONNode(this,in_RSI);
  }
  else {
    uVar2 = type(in_RSI);
    if (uVar2 == '\x05') {
      duplicate(this);
      piVar1 = this->internal;
      piVar1->_type = '\x04';
      ppJVar3 = jsonChildren::begin(piVar1->Children);
      ppJVar4 = jsonChildren::end(this->internal->Children);
      for (; ppJVar3 != ppJVar4; ppJVar3 = ppJVar3 + 1) {
        clear_name(*ppJVar3);
      }
    }
    else {
      JSONNode(this,'\x04');
    }
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode JSONNode::as_array(void) const json_nothrow {
	   JSON_CHECK_INTERNAL();
	   if (type() == JSON_ARRAY){
		  return *this;
	   } else if (type() == JSON_NODE){
		  JSONNode res(duplicate());
		  res.internal -> _type = JSON_ARRAY;
		  json_foreach(res.internal -> CHILDREN, runner){
			 (*runner) -> clear_name();
		  }
		  return res;
	   }
	   #ifdef JSON_MUTEX_CALLBACKS
		  if (internal -> mylock != 0){
			 JSONNode res(JSON_ARRAY);
			 res.set_mutex(internal -> mylock);
			 return res;
		  }
	   #endif
	   return JSONNode(JSON_ARRAY);
    }